

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DrawIndexed
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,DrawIndexedAttribs *Attribs,
          int param_2)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  PRIMITIVE_TOPOLOGY Topology;
  PipelineStateVkImpl *pPVar3;
  bool bVar4;
  Uint32 UVar5;
  GraphicsPipelineDesc *pGVar6;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  COMMAND_QUEUE_TYPE extraout_DL_00;
  char *in_R8;
  char (*in_R9) [8];
  string msg;
  string local_60;
  String local_40;
  
  Type = (COMMAND_QUEUE_TYPE)param_2;
  if ((Attribs->Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != DRAW_FLAG_NONE) {
    if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
      if ((this->m_Desc).IsDeferred == false) {
        FormatString<char[79]>
                  (&local_60,
                   (char (*) [79])
                   "Queue type may never be unknown for immediate contexts. This looks like a bug.")
        ;
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"DrawIndexed",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x8f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      FormatString<char[97]>
                (&local_60,
                 (char (*) [97])
                 "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8f0);
      Type = extraout_DL;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        Type = extraout_DL_00;
      }
    }
    CVar2 = (this->m_Desc).QueueType;
    if ((~CVar2 & 7) != 0) {
      GetCommandQueueTypeString_abi_cxx11_(&local_40,(Diligent *)(ulong)CVar2,Type);
      in_R8 = " queue.";
      FormatString<char[12],char[22],std::__cxx11::string,char[8]>
                (&local_60,(Diligent *)0x6e1306,(char (*) [12])0x7699da,(char (*) [22])&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if ((this->m_pPipelineState).m_pObject == (PipelineStateVkImpl *)0x0) {
      FormatString<char[71]>(&local_60,(char (*) [71])0x6c1e4c);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8f2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    pPVar3 = (this->m_pPipelineState).m_pObject;
    PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
              (&pPVar3->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    if ((pPVar3->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
        .m_Desc.PipelineType != PIPELINE_TYPE_GRAPHICS) {
      pPVar3 = (this->m_pPipelineState).m_pObject;
      PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
                (&pPVar3->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
      FormatString<char[60],char_const*,char[30]>
                (&local_60,(Diligent *)0x6c1e98,
                 (char (*) [60])
                 &(pPVar3->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                  .m_Desc,(char **)"\' is not a graphics pipeline.",(char (*) [30])in_R8);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8f6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if ((this->m_pIndexBuffer).m_pObject == (BufferVkImpl *)0x0) {
      FormatString<char[69]>(&local_60,(char (*) [69])0x6c1ed9);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    bVar4 = VerifyDrawIndexedAttribs(Attribs);
    if (!bVar4) {
      FormatString<char[31]>(&local_60,(char (*) [31])0x6c1f23);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8fa);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pPVar3 = (this->m_pPipelineState).m_pObject;
  if (pPVar3 != (PipelineStateVkImpl *)0x0) {
    pGVar6 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
                       (&pPVar3->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    Topology = pGVar6->PrimitiveTopology;
    UVar5 = GetPrimitiveCount(Topology,Attribs->NumIndices);
    pUVar1 = (this->m_Stats).PrimitiveCounts + Topology;
    *pUVar1 = *pUVar1 + UVar5;
  }
  pUVar1 = &(this->m_Stats).CommandCounters.DrawIndexed;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::DrawIndexed(const DrawIndexedAttribs& Attribs, int)
{
#ifdef DILIGENT_DEVELOPMENT
    if ((Attribs.Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != 0)
    {
        DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "DrawIndexed");

        DEV_CHECK_ERR(m_pPipelineState, "DrawIndexed command arguments are invalid: no pipeline state is bound.");

        DEV_CHECK_ERR(m_pPipelineState->GetDesc().PipelineType == PIPELINE_TYPE_GRAPHICS,
                      "DrawIndexed command arguments are invalid: pipeline state '",
                      m_pPipelineState->GetDesc().Name, "' is not a graphics pipeline.");

        DEV_CHECK_ERR(m_pIndexBuffer, "DrawIndexed command arguments are invalid: no index buffer is bound.");

        DEV_CHECK_ERR(VerifyDrawIndexedAttribs(Attribs), "DrawIndexedAttribs are invalid");
    }
#endif
    if (m_pPipelineState)
    {
        const PRIMITIVE_TOPOLOGY Topology = m_pPipelineState->GetGraphicsPipelineDesc().PrimitiveTopology;
        m_Stats.PrimitiveCounts[Topology] += GetPrimitiveCount(Topology, Attribs.NumIndices);
    }
    ++m_Stats.CommandCounters.DrawIndexed;
}